

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O2

void merge(block *b0,block *b1)

{
  edge *peVar1;
  block **ppbVar2;
  block *local_8;
  
  ppbVar2 = &local_8;
  while (b0 != (block *)0x0) {
    peVar1 = &b0->ef;
    if (b0->sense == 0) {
      peVar1 = &b0->et;
    }
    ppbVar2 = &peVar1->succ;
    b0 = *ppbVar2;
  }
  *ppbVar2 = b1;
  return;
}

Assistant:

static void
merge(b0, b1)
	struct block *b0, *b1;
{
	register struct block **p = &b0;

	/* Find end of list. */
	while (*p)
		p = !((*p)->sense) ? &JT(*p) : &JF(*p);

	/* Concatenate the lists. */
	*p = b1;
}